

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::BlenderImporter::ConvertNode
          (BlenderImporter *this,Scene *in,Object *obj,ConversionData *conv_data,
          aiMatrix4x4 *parentTransform)

{
  pointer *pppaVar1;
  pointer *pppaVar2;
  pointer ppaVar3;
  pointer ppaVar4;
  iterator __position;
  iterator __position_00;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Object *pOVar18;
  _func_int **pp_Var19;
  _func_int **pp_Var20;
  char *pcVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  ConversionData *conv_data_00;
  _Base_ptr p_Var38;
  aiNode *paVar39;
  size_t sVar40;
  ulong uVar41;
  ulong uVar42;
  uint *puVar43;
  float (*pafVar44) [4];
  aiMatrix4x4t<float> *paVar45;
  aiNode **__s;
  Object *extraout_RDX;
  _Rb_tree_header *p_Var46;
  ulong uVar47;
  _Elt_pointer ppOVar48;
  Scene *pSVar49;
  char *pcVar50;
  long lVar51;
  BlenderImporter *this_00;
  long lVar52;
  ConversionData *pCVar53;
  aiMatrix4x4 *paVar54;
  _Self __tmp;
  const_iterator __position_01;
  _Map_pointer pppOVar55;
  _Head_base<0UL,_aiNode_*,_false> _Var56;
  _Elt_pointer ppOVar57;
  float fVar58;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  aiMatrix4x4 m;
  aiMatrix4x4t<float> temp;
  deque<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_> children;
  _Head_base<0UL,_aiNode_*,_false> local_150;
  Object *local_148;
  ConversionData *local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined8 uStack_118;
  undefined8 uStack_110;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  aiMatrix4x4 aStack_f8;
  aiNode *paStack_b8;
  float fStack_b0;
  float fStack_ac;
  _Elt_pointer ppOStack_a0;
  BlenderImporter *local_98;
  Scene *local_90;
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>
  local_88;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  pCVar53 = (ConversionData *)parentTransform;
  local_98 = this;
  local_90 = in;
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  _M_initialize_map(&local_88,0);
  __position_01._M_node = (conv_data->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var46 = &(conv_data->objects)._M_t._M_impl.super__Rb_tree_header;
  local_140 = conv_data;
  if ((_Rb_tree_header *)__position_01._M_node != p_Var46) {
    do {
      local_138._0_8_ = *(undefined8 *)(__position_01._M_node + 1);
      if (((Object *)local_138._0_8_)->parent == obj) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
          ::_M_push_back_aux<Assimp::Blender::Object_const*const&>
                    ((deque<Assimp::Blender::Object_const*,std::allocator<Assimp::Blender::Object_const*>>
                      *)&local_88,(Object **)local_138);
        }
        else {
          *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (Object *)local_138._0_8_;
          local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        p_Var38 = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node);
        std::
        _Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
        ::erase_abi_cxx11_((_Rb_tree<Assimp::Blender::Object_const*,Assimp::Blender::Object_const*,std::_Identity<Assimp::Blender::Object_const*>,Assimp::Blender::ObjectCompare,std::allocator<Assimp::Blender::Object_const*>>
                            *)local_140,__position_01);
      }
      else {
        p_Var38 = (_Base_ptr)std::_Rb_tree_increment(__position_01._M_node);
      }
      __position_01._M_node = p_Var38;
    } while ((_Rb_tree_header *)p_Var38 != p_Var46);
  }
  paVar39 = (aiNode *)operator_new(0x478);
  pcVar50 = (obj->id).name + 2;
  local_138._0_8_ = (Object *)local_128;
  sVar40 = strlen(pcVar50);
  local_148 = obj;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,pcVar50,(obj->id).name + sVar40 + 2);
  aiNode::aiNode(paVar39,(string *)local_138);
  local_150._M_head_impl = paVar39;
  if ((Object *)local_138._0_8_ != (Object *)local_128) {
    operator_delete((void *)local_138._0_8_,local_128._0_8_ + 1);
  }
  conv_data_00 = local_140;
  this_00 = (BlenderImporter *)
            (local_148->data).
            super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (BlenderImporter *)0x0) goto switchD_004cb9d6_caseD_6;
  switch(local_148->type) {
  case Type_MESH:
    ppaVar3 = (local_140->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppaVar4 = (local_140->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar49 = (Scene *)0x6cba15;
    CheckActualType((ElemBase *)this_00,"Mesh");
    ConvertMesh(this_00,pSVar49,extraout_RDX,
                (Mesh *)(local_148->data).
                        super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,conv_data_00,&conv_data_00->meshes);
    _Var56._M_head_impl = local_150._M_head_impl;
    uVar47 = (long)ppaVar3 - (long)ppaVar4 >> 3;
    uVar41 = (long)(conv_data_00->meshes).arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(conv_data_00->meshes).arr.
                   super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar42 = uVar41 - uVar47;
    if (uVar47 <= uVar41 && uVar42 != 0) {
      (local_150._M_head_impl)->mNumMeshes = (uint)uVar42;
      puVar43 = (uint *)operator_new__((uVar42 & 0xffffffff) << 2);
      (_Var56._M_head_impl)->mMeshes = puVar43;
      if ((_Var56._M_head_impl)->mNumMeshes != 0) {
        uVar41 = 0;
        do {
          (_Var56._M_head_impl)->mMeshes[uVar41] = (int)uVar47 + (int)uVar41;
          uVar41 = uVar41 + 1;
          _Var56._M_head_impl = local_150._M_head_impl;
        } while (uVar41 < (local_150._M_head_impl)->mNumMeshes);
      }
    }
    goto switchD_004cb9d6_caseD_6;
  case Type_CURVE:
    pcVar50 = "Curve";
    break;
  case Type_SURF:
    pcVar50 = "Surface";
    break;
  case Type_FONT:
    pcVar50 = "Font";
    break;
  case Type_MBALL:
    pcVar50 = "MetaBall";
    break;
  default:
    goto switchD_004cb9d6_caseD_6;
  case Type_LAMP:
    pcVar50 = "Lamp";
    CheckActualType((ElemBase *)this_00,"Lamp");
    local_138._0_8_ =
         ConvertLight(this_00,(Scene *)pcVar50,local_148,
                      (Lamp *)(local_148->data).
                              super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,pCVar53);
    __position._M_current =
         (local_140->lights).arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_140->lights).arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
                ((vector<aiLight*,std::allocator<aiLight*>> *)&local_140->lights,__position,
                 (aiLight **)local_138);
    }
    else {
      *__position._M_current = (aiLight *)local_138._0_8_;
      pppaVar1 = &(local_140->lights).arr.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppaVar1 = *pppaVar1 + 1;
    }
    goto switchD_004cb9d6_caseD_6;
  case Type_CAMERA:
    pSVar49 = (Scene *)0x6f26f9;
    CheckActualType((ElemBase *)this_00,"Camera");
    local_138._0_8_ =
         ConvertCamera(this_00,pSVar49,local_148,
                       (Camera *)
                       (local_148->data).
                       super___shared_ptr<Assimp::Blender::ElemBase,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,pCVar53);
    __position_00._M_current =
         (local_140->cameras).arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (local_140->cameras).arr.super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiCamera*,std::allocator<aiCamera*>>::_M_realloc_insert<aiCamera*const&>
                ((vector<aiCamera*,std::allocator<aiCamera*>> *)&local_140->cameras,__position_00,
                 (aiCamera **)local_138);
    }
    else {
      *__position_00._M_current = (aiCamera *)local_138._0_8_;
      pppaVar2 = &(local_140->cameras).arr.
                  super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppaVar2 = *pppaVar2 + 1;
    }
    goto switchD_004cb9d6_caseD_6;
  case Type_WAVE:
    pcVar50 = "Wave";
    break;
  case Type_LATTICE:
    pcVar50 = "Lattice";
  }
  NotSupportedObjectType(local_148,pcVar50);
switchD_004cb9d6_caseD_6:
  pafVar44 = local_148->obmat;
  lVar51 = 0;
  do {
    fVar58 = (*pafVar44)[0];
    paVar54 = &(local_150._M_head_impl)->mTransformation;
    lVar52 = 0;
    while( true ) {
      (&paVar54->a1)[lVar51] = fVar58;
      if (lVar52 + 1 == 4) break;
      fVar58 = (*pafVar44)[lVar52 + 1];
      paVar54 = (aiMatrix4x4 *)&((local_150._M_head_impl)->mTransformation).b1;
      lVar52 = lVar52 + 1;
    }
    lVar51 = lVar51 + 1;
    pafVar44 = pafVar44 + 1;
  } while (lVar51 != 4);
  local_138._0_8_ = *(undefined8 *)parentTransform;
  local_138._8_4_ = parentTransform->a3;
  local_138._12_4_ = parentTransform->a4;
  local_128._0_8_ = *(undefined8 *)&parentTransform->b1;
  local_128._8_8_ = *(undefined8 *)&parentTransform->b3;
  uStack_118 = *(_func_int ***)&parentTransform->c1;
  uStack_110 = *(char **)&parentTransform->c3;
  _fStack_108 = *(undefined8 *)&parentTransform->d1;
  _fStack_100 = *(undefined8 *)&parentTransform->d3;
  paVar45 = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)local_138);
  pppOVar55 = local_88._M_impl.super__Deque_impl_data._M_start._M_node;
  ppOVar57 = local_88._M_impl.super__Deque_impl_data._M_start._M_last;
  ppOVar48 = local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
  pOVar18 = *(Object **)paVar45;
  local_138._8_4_ = paVar45->a3;
  local_138._12_4_ = paVar45->a4;
  pp_Var19 = *(_func_int ***)&paVar45->b1;
  pcVar50 = *(char **)&paVar45->b3;
  pp_Var20 = *(_func_int ***)&paVar45->c1;
  pcVar21 = *(char **)&paVar45->c3;
  _fStack_108 = *(undefined8 *)&paVar45->d1;
  _fStack_100 = *(undefined8 *)&paVar45->d3;
  local_138._0_4_ = SUB84(pOVar18,0);
  local_138._4_4_ = (undefined4)((ulong)pOVar18 >> 0x20);
  local_128._0_4_ = SUB84(pp_Var19,0);
  local_128._4_4_ = (undefined4)((ulong)pp_Var19 >> 0x20);
  local_128._8_4_ = SUB84(pcVar50,0);
  local_128._12_4_ = (undefined4)((ulong)pcVar50 >> 0x20);
  uStack_118._0_4_ = SUB84(pp_Var20,0);
  uStack_118._4_4_ = (float)((ulong)pp_Var20 >> 0x20);
  uStack_110._0_4_ = SUB84(pcVar21,0);
  uStack_110._4_4_ = (float)((ulong)pcVar21 >> 0x20);
  fVar58 = ((local_150._M_head_impl)->mTransformation).a1;
  fVar5 = ((local_150._M_head_impl)->mTransformation).a2;
  paStack_b8 = *(aiNode **)&(local_150._M_head_impl)->mTransformation;
  fStack_b0 = ((local_150._M_head_impl)->mTransformation).a3;
  fStack_ac = ((local_150._M_head_impl)->mTransformation).a4;
  fVar6 = ((local_150._M_head_impl)->mTransformation).b1;
  fVar7 = ((local_150._M_head_impl)->mTransformation).b2;
  fVar8 = ((local_150._M_head_impl)->mTransformation).b3;
  fVar9 = ((local_150._M_head_impl)->mTransformation).b4;
  fVar10 = ((local_150._M_head_impl)->mTransformation).c1;
  fVar11 = ((local_150._M_head_impl)->mTransformation).c2;
  fVar12 = ((local_150._M_head_impl)->mTransformation).c3;
  fVar13 = ((local_150._M_head_impl)->mTransformation).c4;
  fVar14 = ((local_150._M_head_impl)->mTransformation).d1;
  fVar15 = ((local_150._M_head_impl)->mTransformation).d2;
  fVar16 = ((local_150._M_head_impl)->mTransformation).d3;
  fVar17 = ((local_150._M_head_impl)->mTransformation).d4;
  ((local_150._M_head_impl)->mTransformation).a1 =
       (float)local_138._12_4_ * fVar14 +
       (float)local_138._8_4_ * fVar10 +
       (float)local_138._0_4_ * fVar58 + (float)local_138._4_4_ * fVar6;
  ((local_150._M_head_impl)->mTransformation).a2 =
       (float)local_138._12_4_ * fVar15 +
       (float)local_138._8_4_ * fVar11 +
       (float)local_138._0_4_ * fVar5 + (float)local_138._4_4_ * fVar7;
  ((local_150._M_head_impl)->mTransformation).a3 =
       (float)local_138._12_4_ * fVar16 +
       (float)local_138._8_4_ * fVar12 +
       (float)local_138._0_4_ * fStack_b0 + (float)local_138._4_4_ * fVar8;
  ((local_150._M_head_impl)->mTransformation).a4 =
       (float)local_138._12_4_ * fVar17 +
       (float)local_138._8_4_ * fVar13 +
       (float)local_138._0_4_ * fStack_ac + (float)local_138._4_4_ * fVar9;
  ((local_150._M_head_impl)->mTransformation).b1 =
       (float)local_128._12_4_ * fVar14 +
       (float)local_128._8_4_ * fVar10 +
       (float)local_128._0_4_ * fVar58 + (float)local_128._4_4_ * fVar6;
  ((local_150._M_head_impl)->mTransformation).b2 =
       (float)local_128._12_4_ * fVar15 +
       (float)local_128._8_4_ * fVar11 +
       (float)local_128._0_4_ * fVar5 + (float)local_128._4_4_ * fVar7;
  ((local_150._M_head_impl)->mTransformation).b3 =
       (float)local_128._12_4_ * fVar16 +
       (float)local_128._8_4_ * fVar12 +
       (float)local_128._0_4_ * fStack_b0 + (float)local_128._4_4_ * fVar8;
  ((local_150._M_head_impl)->mTransformation).b4 =
       (float)local_128._12_4_ * fVar17 +
       (float)local_128._8_4_ * fVar13 +
       (float)local_128._0_4_ * fStack_ac + (float)local_128._4_4_ * fVar9;
  ((local_150._M_head_impl)->mTransformation).c1 =
       uStack_110._4_4_ * fVar14 +
       (float)uStack_110 * fVar10 + (float)uStack_118 * fVar58 + uStack_118._4_4_ * fVar6;
  ((local_150._M_head_impl)->mTransformation).c2 =
       uStack_110._4_4_ * fVar15 +
       (float)uStack_110 * fVar11 + (float)uStack_118 * fVar5 + uStack_118._4_4_ * fVar7;
  ((local_150._M_head_impl)->mTransformation).c3 =
       uStack_110._4_4_ * fVar16 +
       (float)uStack_110 * fVar12 + (float)uStack_118 * fStack_b0 + uStack_118._4_4_ * fVar8;
  ((local_150._M_head_impl)->mTransformation).c4 =
       uStack_110._4_4_ * fVar17 +
       (float)uStack_110 * fVar13 + (float)uStack_118 * fStack_ac + uStack_118._4_4_ * fVar9;
  ((local_150._M_head_impl)->mTransformation).d1 =
       fStack_fc * fVar14 + fStack_100 * fVar10 + fStack_108 * fVar58 + fStack_104 * fVar6;
  ((local_150._M_head_impl)->mTransformation).d2 =
       fStack_fc * fVar15 + fStack_100 * fVar11 + fStack_108 * fVar5 + fStack_104 * fVar7;
  ((local_150._M_head_impl)->mTransformation).d3 =
       fStack_fc * fVar16 + fStack_100 * fVar12 + fStack_108 * fStack_b0 + fStack_104 * fVar8;
  ((local_150._M_head_impl)->mTransformation).d4 =
       fStack_fc * fVar17 + fStack_100 * fVar13 + fStack_108 * fStack_ac + fStack_104 * fVar9;
  ppOStack_a0 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uVar41 = ((long)local_88._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_88._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
           ((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_88._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)local_88._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_88._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_88._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x40;
  local_138._0_8_ = pOVar18;
  local_128._0_8_ = pp_Var19;
  local_128._8_8_ = pcVar50;
  uStack_118 = pp_Var20;
  uStack_110 = pcVar21;
  if (uVar41 != 0) {
    paStack_b8 = local_150._M_head_impl;
    (local_150._M_head_impl)->mNumChildren = (uint)uVar41;
    uVar41 = (uVar41 & 0xffffffff) << 3;
    __s = (aiNode **)operator_new__(uVar41);
    memset(__s,0,uVar41);
    paStack_b8->mChildren = __s;
    if (ppOVar48 != ppOStack_a0) {
      do {
        uVar22 = ((local_150._M_head_impl)->mTransformation).a1;
        uVar23 = ((local_150._M_head_impl)->mTransformation).a2;
        uVar24 = ((local_150._M_head_impl)->mTransformation).a3;
        uVar25 = ((local_150._M_head_impl)->mTransformation).a4;
        uVar26 = ((local_150._M_head_impl)->mTransformation).b1;
        uVar27 = ((local_150._M_head_impl)->mTransformation).b2;
        uVar28 = ((local_150._M_head_impl)->mTransformation).b3;
        uVar29 = ((local_150._M_head_impl)->mTransformation).b4;
        uVar30 = ((local_150._M_head_impl)->mTransformation).c1;
        uVar31 = ((local_150._M_head_impl)->mTransformation).c2;
        uVar32 = ((local_150._M_head_impl)->mTransformation).c3;
        uVar33 = ((local_150._M_head_impl)->mTransformation).c4;
        uVar34 = ((local_150._M_head_impl)->mTransformation).d1;
        uVar35 = ((local_150._M_head_impl)->mTransformation).d2;
        uVar36 = ((local_150._M_head_impl)->mTransformation).d3;
        uVar37 = ((local_150._M_head_impl)->mTransformation).d4;
        fVar58 = parentTransform->a1;
        fVar5 = parentTransform->a2;
        paStack_b8 = *(aiNode **)parentTransform;
        fStack_b0 = parentTransform->a3;
        fStack_ac = parentTransform->a4;
        fVar6 = parentTransform->b1;
        fVar7 = parentTransform->b2;
        fVar8 = parentTransform->b3;
        fVar9 = parentTransform->b4;
        fVar10 = parentTransform->c1;
        fVar11 = parentTransform->c2;
        fVar12 = parentTransform->c3;
        fVar13 = parentTransform->c4;
        fVar14 = parentTransform->d1;
        fVar15 = parentTransform->d2;
        fVar16 = parentTransform->d3;
        fVar17 = parentTransform->d4;
        aStack_f8.a2 = (float)uVar25 * fVar15 +
                       (float)uVar24 * fVar11 + (float)uVar22 * fVar5 + (float)uVar23 * fVar7;
        aStack_f8.a1 = (float)uVar25 * fVar14 +
                       (float)uVar24 * fVar10 + (float)uVar22 * fVar58 + (float)uVar23 * fVar6;
        aStack_f8.a4 = (float)uVar25 * fVar17 +
                       (float)uVar24 * fVar13 + (float)uVar22 * fStack_ac + (float)uVar23 * fVar9;
        aStack_f8.a3 = (float)uVar25 * fVar16 +
                       (float)uVar24 * fVar12 + (float)uVar22 * fStack_b0 + (float)uVar23 * fVar8;
        aStack_f8.b2 = (float)uVar29 * fVar15 +
                       (float)uVar28 * fVar11 + (float)uVar26 * fVar5 + (float)uVar27 * fVar7;
        aStack_f8.b1 = (float)uVar29 * fVar14 +
                       (float)uVar28 * fVar10 + (float)uVar26 * fVar58 + (float)uVar27 * fVar6;
        aStack_f8.b4 = (float)uVar29 * fVar17 +
                       (float)uVar28 * fVar13 + (float)uVar26 * fStack_ac + (float)uVar27 * fVar9;
        aStack_f8.b3 = (float)uVar29 * fVar16 +
                       (float)uVar28 * fVar12 + (float)uVar26 * fStack_b0 + (float)uVar27 * fVar8;
        aStack_f8.c2 = (float)uVar33 * fVar15 +
                       (float)uVar32 * fVar11 + (float)uVar30 * fVar5 + (float)uVar31 * fVar7;
        aStack_f8.c1 = (float)uVar33 * fVar14 +
                       (float)uVar32 * fVar10 + (float)uVar30 * fVar58 + (float)uVar31 * fVar6;
        aStack_f8.c4 = (float)uVar33 * fVar17 +
                       (float)uVar32 * fVar13 + (float)uVar30 * fStack_ac + (float)uVar31 * fVar9;
        aStack_f8.c3 = (float)uVar33 * fVar16 +
                       (float)uVar32 * fVar12 + (float)uVar30 * fStack_b0 + (float)uVar31 * fVar8;
        aStack_f8.d2 = (float)uVar37 * fVar15 +
                       (float)uVar36 * fVar11 + (float)uVar34 * fVar5 + (float)uVar35 * fVar7;
        aStack_f8.d1 = (float)uVar37 * fVar14 +
                       (float)uVar36 * fVar10 + (float)uVar34 * fVar58 + (float)uVar35 * fVar6;
        aStack_f8.d4 = (float)uVar37 * fVar17 +
                       (float)uVar36 * fVar13 + (float)uVar34 * fStack_ac + (float)uVar35 * fVar9;
        aStack_f8.d3 = (float)uVar37 * fVar16 +
                       (float)uVar36 * fVar12 + (float)uVar34 * fStack_b0 + (float)uVar35 * fVar8;
        paVar39 = ConvertNode(local_98,local_90,*ppOVar48,local_140,&aStack_f8);
        *__s = paVar39;
        paVar39->mParent = local_150._M_head_impl;
        ppOVar48 = ppOVar48 + 1;
        if (ppOVar48 == ppOVar57) {
          ppOVar48 = pppOVar55[1];
          pppOVar55 = pppOVar55 + 1;
          ppOVar57 = ppOVar48 + 0x40;
        }
        __s = __s + 1;
      } while (ppOVar48 != ppOStack_a0);
    }
  }
  Blender::BlenderModifierShowcase::ApplyModifiers
            (local_98->modifier_cache,local_150._M_head_impl,local_140,local_90,local_148);
  _Var56._M_head_impl = local_150._M_head_impl;
  local_150._M_head_impl = (aiNode *)0x0;
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr
            ((unique_ptr<aiNode,_std::default_delete<aiNode>_> *)&local_150);
  std::
  _Deque_base<const_Assimp::Blender::Object_*,_std::allocator<const_Assimp::Blender::Object_*>_>::
  ~_Deque_base(&local_88);
  return _Var56._M_head_impl;
}

Assistant:

aiNode* BlenderImporter::ConvertNode(const Scene& in, const Object* obj, ConversionData& conv_data, const aiMatrix4x4& parentTransform)
{
    std::deque<const Object*> children;
    for(ObjectSet::iterator it = conv_data.objects.begin(); it != conv_data.objects.end() ;) {
        const Object* object = *it;
        if (object->parent == obj) {
            children.push_back(object);

            conv_data.objects.erase(it++);
            continue;
        }
        ++it;
    }

    std::unique_ptr<aiNode> node(new aiNode(obj->id.name+2)); // skip over the name prefix 'OB'
    if (obj->data) {
        switch (obj->type)
        {
        case Object :: Type_EMPTY:
            break; // do nothing


            // supported object types
        case Object :: Type_MESH: {
            const size_t old = conv_data.meshes->size();

            CheckActualType(obj->data.get(),"Mesh");
            ConvertMesh(in,obj,static_cast<const Mesh*>(obj->data.get()),conv_data,conv_data.meshes);

            if (conv_data.meshes->size() > old) {
                node->mMeshes = new unsigned int[node->mNumMeshes = static_cast<unsigned int>(conv_data.meshes->size()-old)];
                for (unsigned int i = 0; i < node->mNumMeshes; ++i) {
                    node->mMeshes[i] = static_cast<unsigned int>(i + old);
                }
            }}
            break;
        case Object :: Type_LAMP: {
            CheckActualType(obj->data.get(),"Lamp");
            aiLight* mesh = ConvertLight(in,obj,static_cast<const Lamp*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.lights->push_back(mesh);
            }}
            break;
        case Object :: Type_CAMERA: {
            CheckActualType(obj->data.get(),"Camera");
            aiCamera* mesh = ConvertCamera(in,obj,static_cast<const Camera*>(
                obj->data.get()),conv_data);

            if (mesh) {
                conv_data.cameras->push_back(mesh);
            }}
            break;


            // unsupported object types / log, but do not break
        case Object :: Type_CURVE:
            NotSupportedObjectType(obj,"Curve");
            break;
        case Object :: Type_SURF:
            NotSupportedObjectType(obj,"Surface");
            break;
        case Object :: Type_FONT:
            NotSupportedObjectType(obj,"Font");
            break;
        case Object :: Type_MBALL:
            NotSupportedObjectType(obj,"MetaBall");
            break;
        case Object :: Type_WAVE:
            NotSupportedObjectType(obj,"Wave");
            break;
        case Object :: Type_LATTICE:
            NotSupportedObjectType(obj,"Lattice");
            break;

            // invalid or unknown type
        default:
            break;
        }
    }

    for(unsigned int x = 0; x < 4; ++x) {
        for(unsigned int y = 0; y < 4; ++y) {
            node->mTransformation[y][x] = obj->obmat[x][y];
        }
    }

    aiMatrix4x4 m = parentTransform;
    m = m.Inverse();

    node->mTransformation = m*node->mTransformation;

    if (children.size()) {
        node->mNumChildren = static_cast<unsigned int>(children.size());
        aiNode** nd = node->mChildren = new aiNode*[node->mNumChildren]();
        for (const Object* nobj :children) {
            *nd = ConvertNode(in,nobj,conv_data,node->mTransformation * parentTransform);
            (*nd++)->mParent = node.get();
        }
    }

    // apply modifiers
    modifier_cache->ApplyModifiers(*node,conv_data,in,*obj);

    return node.release();
}